

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::MakeLayer::logic_error(MakeLayer *this,string *what)

{
  long *plVar1;
  logic_error *this_00;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> m;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_38,"cannot create ",what);
  plVar1 = (long *)::std::__cxx11::string::append((char *)&local_38);
  local_58 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_58 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
  }
  local_50 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,(string *)&local_58);
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

void logic_error(std::string what) {
        auto m = "cannot create " + what + ": invalid configuration";
        throw std::logic_error(m);
     }